

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::AddEntityAppearance
          (SilentEntitySystem *this,EntityAppearance *EA)

{
  iterator __position;
  pointer pEVar1;
  KException *this_00;
  EntityAppearance *pEVar2;
  KString local_40;
  
  pEVar1 = (this->m_vEA).
           super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->m_vEA).
       super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)__position._M_current - (long)pEVar1 >> 4) < (ulong)this->m_ui16NumEnts) {
    if (__position._M_current ==
        (this->m_vEA).
        super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<KDIS::DATA_TYPE::EntityAppearance,std::allocator<KDIS::DATA_TYPE::EntityAppearance>>::
      _M_realloc_insert<KDIS::DATA_TYPE::EntityAppearance_const&>
                ((vector<KDIS::DATA_TYPE::EntityAppearance,std::allocator<KDIS::DATA_TYPE::EntityAppearance>>
                  *)&this->m_vEA,__position,EA);
      pEVar1 = (this->m_vEA).
               super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar2 = (this->m_vEA).
               super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      ((__position._M_current)->super_DataTypeBase)._vptr_DataTypeBase =
           (_func_int **)&PTR__EntityAppearance_00224b50;
      (__position._M_current)->m_Appearance = EA->m_Appearance;
      pEVar2 = __position._M_current + 1;
      (this->m_vEA).
      super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
      ._M_impl.super__Vector_impl_data._M_finish = pEVar2;
    }
    this->m_ui16NumOfAppearanceRecords = (KUINT16)((uint)((int)pEVar2 - (int)pEVar1) >> 4);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"AddEntityAppearance","");
  KException::KException(this_00,&local_40,7);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void SilentEntitySystem::AddEntityAppearance(const EntityAppearance &EA) noexcept(false)
{
    if( m_vEA.size() >= m_ui16NumEnts )throw KException( __FUNCTION__, OUT_OF_BOUNDS );


    m_vEA.push_back( EA );
    m_ui16NumOfAppearanceRecords = m_vEA.size();
}